

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void cli::cleanPath(string *path)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  pcVar2 = pcVar1;
  if (path->_M_string_length != 0) {
    do {
      if (*pcVar1 == '\\') {
        *pcVar1 = '/';
      }
      pcVar1 = pcVar1 + 1;
      pcVar2 = (path->_M_dataplus)._M_p + path->_M_string_length;
    } while (pcVar1 != pcVar2);
  }
  if (pcVar2[-1] == '*') {
    std::__cxx11::string::pop_back();
  }
  if ((path->_M_dataplus)._M_p[path->_M_string_length - 1] != '/') {
    return;
  }
  std::__cxx11::string::pop_back();
  return;
}

Assistant:

void cleanPath(std::string &path)
	{
		for (std::string::iterator it = path.begin(); it != path.end(); ++it)
		{
			if ((*it) == '\\')
				(*it) = '/';
		}

		if (path.back() == '*')
			path.pop_back();
		if (path.back() == '/')
			path.pop_back();
	}